

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall
kj::Path::evalWin32Impl
          (Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path,
          bool fromApi)

{
  bool bVar1;
  char cVar2;
  String *this_00;
  size_t sVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  __off_t __length_00;
  char (*params) [3];
  StringPtr SVar6;
  ArrayPtr<const_char> AVar7;
  Range<unsigned_long> RVar8;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  bool local_239;
  bool local_209;
  Array<kj::String> local_208;
  ArrayPtr<const_char> local_1f0;
  ArrayPtr<const_char> local_1e0;
  ArrayPtr<const_char> local_1d0;
  size_t local_1c0;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  size_t partStart;
  Fault f_2;
  String local_170;
  Fault local_158;
  Fault f_1;
  Fault local_140;
  Fault f;
  StringPtr local_118;
  ArrayPtr<const_char> local_108;
  StringPtr local_f8;
  ArrayPtr<const_char> local_e8;
  StringPtr local_d8;
  StringPtr local_c8;
  char *local_b8;
  char *c;
  char *__end2;
  char *__begin2;
  String *__range2;
  char *pcStack_90;
  String local_88;
  byte local_6d;
  StringPtr local_60;
  undefined1 local_50 [8];
  String ownPath;
  bool fromApi_local;
  Vector<kj::String> *parts_local;
  StringPtr path_local;
  __off_t __length;
  
  pcVar5 = path.content.ptr;
  ownPath.content.disposer._7_1_ = (byte)path.content.size_ & 1;
  parts_local = parts;
  path_local.content.ptr = pcVar5;
  String::String((String *)local_50);
  sVar3 = CONCAT71((int7)((ulong)pcVar5 >> 8),ownPath.content.disposer._7_1_);
  local_6d = 0;
  local_209 = false;
  if ((ownPath.content.disposer._7_1_ & 1) == 0) {
    StringPtr::findFirst(&local_60,(char)&parts_local);
    local_6d = 1;
    local_209 = Maybe<unsigned_long>::operator!=((Maybe<unsigned_long> *)&local_60,(void *)0x0);
  }
  if ((local_6d & 1) != 0) {
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_60);
  }
  if (local_209 != false) {
    __range2 = (String *)parts_local;
    pcStack_90 = path_local.content.ptr;
    SVar6.content.size_ = sVar3;
    SVar6.content.ptr = path_local.content.ptr;
    heapString(&local_88,(kj *)parts_local,SVar6);
    String::operator=((String *)local_50,&local_88);
    String::~String(&local_88);
    __begin2 = local_50;
    __end2 = String::begin((String *)__begin2);
    c = String::end((String *)__begin2);
    for (; __end2 != c; __end2 = __end2 + 1) {
      local_b8 = __end2;
      if (*__end2 == '/') {
        *__end2 = '\\';
      }
    }
    StringPtr::StringPtr(&local_c8,(String *)local_50);
    parts_local = (Vector<kj::String> *)local_c8.content.ptr;
    path_local.content.ptr = (char *)local_c8.content.size_;
  }
  local_239 = false;
  if ((ownPath.content.disposer._7_1_ & 1) != 0) {
    StringPtr::StringPtr(&local_d8,"\\\\?\\");
    local_239 = StringPtr::startsWith((StringPtr *)&parts_local,&local_d8);
  }
  if (local_239 != false) {
    local_e8 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&parts_local,4);
    path_local.content.ptr = (char *)local_e8.size_;
    parts_local = (Vector<kj::String> *)local_e8.ptr;
    StringPtr::StringPtr(&local_f8,"UNC\\");
    bVar1 = StringPtr::startsWith((StringPtr *)&parts_local,&local_f8);
    AVar7.size_ = (size_t)path_local.content.ptr;
    AVar7.ptr = (char *)parts_local;
    if (bVar1) {
      local_108 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&parts_local,4);
      AVar7 = local_108;
    }
    path_local.content.ptr = (char *)AVar7.size_;
    parts_local = (Vector<kj::String> *)AVar7.ptr;
    Vector<kj::String>::clear((Vector<kj::String> *)this);
    goto LAB_004f35b8;
  }
  StringPtr::StringPtr(&local_118,"\\\\");
  bVar1 = StringPtr::startsWith((StringPtr *)&parts_local,&local_118);
  if (bVar1) {
    SVar6 = StringPtr::slice((StringPtr *)&parts_local,2);
    path_local.content.ptr = (char *)SVar6.content.size_;
    parts_local = (Vector<kj::String> *)SVar6.content.ptr;
    Vector<kj::String>::clear((Vector<kj::String> *)this);
  }
  else {
    StringPtr::StringPtr((StringPtr *)&f,"\\");
    bVar1 = StringPtr::startsWith((StringPtr *)&parts_local,(StringPtr *)&f);
    if (bVar1) {
      if (((ownPath.content.disposer._7_1_ ^ 0xff) & 1) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                  (&local_140,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x177,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
                   (char (*) [39])"parseWin32Api() requires absolute path");
        kj::_::Debug::Fault::fatal(&local_140);
      }
      sVar3 = Vector<kj::String>::size((Vector<kj::String> *)this);
      if (sVar3 != 0) {
        this_00 = Vector<kj::String>::operator[]((Vector<kj::String> *)this,0);
        AVar7 = String::operator_cast_to_ArrayPtr(this_00);
        part.size_ = (char *)AVar7.size_;
        f_1.exception = (Exception *)AVar7.ptr;
        part.ptr = part.size_;
        bVar1 = isWin32Drive((Path *)f_1.exception,part);
        if (bVar1) {
          Vector<kj::String>::truncate((Vector<kj::String> *)this,(char *)0x1,__length);
          goto LAB_004f35b6;
        }
      }
      sVar3 = Vector<kj::String>::size((Vector<kj::String> *)this);
      if (sVar3 < 2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                  (&local_158,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x182,FAILED,(char *)0x0,"\"must specify drive letter\", path",
                   (char (*) [26])"must specify drive letter",(StringPtr *)&parts_local);
        Vector<kj::String>::clear((Vector<kj::String> *)this);
        str<char_const(&)[3]>(&local_170,(kj *)"c:",params);
        Vector<kj::String>::add<kj::String>((Vector<kj::String> *)this,&local_170);
        String::~String(&local_170);
        kj::_::Debug::Fault::~Fault(&local_158);
      }
      else {
        Vector<kj::String>::truncate((Vector<kj::String> *)this,(char *)0x2,__length_00);
      }
    }
    else {
      sVar3 = StringPtr::size((StringPtr *)&parts_local);
      if ((sVar3 == 2) ||
         ((sVar3 = StringPtr::size((StringPtr *)&parts_local), 2 < sVar3 &&
          (cVar2 = StringPtr::operator[]((StringPtr *)&parts_local,2), cVar2 == '\\')))) {
        AVar7 = StringPtr::slice((StringPtr *)&parts_local,0,2);
        part_00.size_ = (char *)AVar7.size_;
        f_2.exception = (Exception *)AVar7.ptr;
        part_00.ptr = part_00.size_;
        bVar1 = isWin32Drive((Path *)f_2.exception,part_00);
        if (bVar1) {
          Vector<kj::String>::clear((Vector<kj::String> *)this);
          goto LAB_004f35b6;
        }
      }
      if (((ownPath.content.disposer._7_1_ ^ 0xff) & 1) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                  ((Fault *)&partStart,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x18e,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
                   (char (*) [39])"parseWin32Api() requires absolute path");
        kj::_::Debug::Fault::fatal((Fault *)&partStart);
      }
    }
  }
LAB_004f35b6:
LAB_004f35b8:
  __range1 = (Range<unsigned_long> *)0x0;
  RVar8 = indices<kj::StringPtr&>((StringPtr *)&parts_local);
  __begin1.value = RVar8.begin_;
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator!=(&__end1,(Iterator *)&i);
    if (!bVar1) break;
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1);
    local_1c0 = *puVar4;
    cVar2 = StringPtr::operator[]((StringPtr *)&parts_local,local_1c0);
    if (cVar2 == '\\') {
      AVar7 = StringPtr::slice((StringPtr *)&parts_local,(size_t)__range1,local_1c0);
      local_1d0 = AVar7;
      evalPart((Vector<kj::String> *)this,AVar7);
      __range1 = (Range<unsigned_long> *)(local_1c0 + 1);
    }
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  local_1f0 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&parts_local,(size_t)__range1);
  local_1e0 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_1f0);
  evalPart((Vector<kj::String> *)this,local_1e0);
  Vector<kj::String>::releaseAsArray(&local_208,(Vector<kj::String> *)this);
  Path(__return_storage_ptr__,&local_208,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_208);
  String::~String((String *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalWin32Impl(Vector<String>&& parts, StringPtr path, bool fromApi) {
  // Convert all forward slashes to backslashes.
  String ownPath;
  if (!fromApi && path.findFirst('/') != nullptr) {
    ownPath = heapString(path);
    for (char& c: ownPath) {
      if (c == '/') c = '\\';
    }
    path = ownPath;
  }

  // Interpret various forms of absolute paths.
  if (fromApi && path.startsWith("\\\\?\\")) {
    path = path.slice(4);
    if (path.startsWith("UNC\\")) {
      path = path.slice(4);
    }

    // The path is absolute.
    parts.clear();
  } else if (path.startsWith("\\\\")) {
    // UNC path.
    path = path.slice(2);

    // This path is absolute. The first component is a server name.
    parts.clear();
  } else if (path.startsWith("\\")) {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");

    // Path is relative to the current drive / network share.
    if (parts.size() >= 1 && isWin32Drive(parts[0])) {
      // Leading \ interpreted as root of current drive.
      parts.truncate(1);
    } else if (parts.size() >= 2) {
      // Leading \ interpreted as root of current network share (which is indicated by the first
      // *two* components of the path).
      parts.truncate(2);
    } else {
      KJ_FAIL_REQUIRE("must specify drive letter", path) {
        // Recover by assuming C drive.
        parts.clear();
        parts.add(kj::str("c:"));
        break;
      }
    }
  } else if ((path.size() == 2 || (path.size() > 2 && path[2] == '\\')) &&
             isWin32Drive(path.slice(0, 2))) {
    // Starts with a drive letter.
    parts.clear();
  } else {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '\\') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}